

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O1

void __thiscall google::protobuf::internal::ExtensionSet::~ExtensionSet(ExtensionSet *this)

{
  uint uVar1;
  KeyValue *pKVar2;
  KeyValue *this_00;
  long lVar3;
  long lVar4;
  KeyValue *pKVar5;
  bool bVar6;
  iterator iVar7;
  iterator iVar8;
  
  if (this->arena_ == (Arena *)0x0) {
    lVar3 = (long)(short)this->flat_size_;
    this_00 = (this->map_).flat;
    if (lVar3 < 0) {
      iVar7 = absl::lts_20250127::container_internal::
              btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::begin((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                       *)this_00);
      iVar8 = absl::lts_20250127::container_internal::
              btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
              ::end((btree<absl::lts_20250127::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                     *)(this->map_).flat);
      ForEachPrefetchImpl<absl::lts_20250127::container_internal::btree_iterator<absl::lts_20250127::container_internal::btree_node<absl::lts_20250127::container_internal::map_params<int,google::protobuf::internal::ExtensionSet::Extension,std::less<int>,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>,256,false>>,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>&,std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>*>,google::protobuf::internal::ExtensionSet::~btree_iterator()::__0,google::protobuf::internal::ExtensionSet::PrefetchNta>
                (iVar7.node_,iVar7.position_,iVar8.node_,iVar8._8_8_ & 0xffffffff);
    }
    else {
      lVar4 = lVar3 * 0x20;
      pKVar2 = this_00;
      if (this->flat_size_ != 0) {
        uVar1 = 0;
        do {
          lVar4 = lVar4 + -0x20;
          Extension::PrefetchPtr(&pKVar2->second);
          pKVar2 = pKVar2 + 1;
          if (lVar4 == 0) break;
          bVar6 = uVar1 < 0xf;
          uVar1 = uVar1 + 1;
        } while (bVar6);
      }
      pKVar5 = this_00 + lVar3;
      for (; pKVar2 != pKVar5; pKVar2 = pKVar2 + 1) {
        Extension::Free(&this_00->second);
        Extension::PrefetchPtr(&pKVar2->second);
        this_00 = this_00 + 1;
      }
      for (; this_00 != pKVar5; this_00 = this_00 + 1) {
        Extension::Free(&this_00->second);
      }
    }
    if (-1 < (short)this->flat_size_) {
      operator_delete__((this->map_).flat,(ulong)this->flat_capacity_ << 5);
      return;
    }
    ~ExtensionSet((ExtensionSet *)(this->map_).flat);
  }
  return;
}

Assistant:

ExtensionSet::~ExtensionSet() {
  // Deletes all allocated extensions.
  if (arena_ == nullptr) {
    ForEach([](int /* number */, Extension& ext) { ext.Free(); },
            PrefetchNta{});
    if (ABSL_PREDICT_FALSE(is_large())) {
      delete map_.large;
    } else {
      DeleteFlatMap(map_.flat, flat_capacity_);
    }
  }
}